

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v6::detail::
       parse_precision<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  char *pcVar1;
  error_handler eVar2;
  type tVar3;
  uint uVar4;
  char *in_RAX;
  int iVar5;
  char *unaff_RBX;
  error_handler *peVar6;
  
  pcVar1 = begin + 1;
  if (pcVar1 == end) {
    iVar5 = 0;
  }
  else {
    iVar5 = (int)*pcVar1;
  }
  if (iVar5 - 0x30U < 10) {
    if ((pcVar1 == end) || (9 < (byte)(*pcVar1 - 0x30U))) {
      assert_fail(unaff_RBX,0,in_RAX);
    }
    peVar6 = (error_handler *)(begin + 2);
    uVar4 = 0;
    do {
      if (0xccccccc < uVar4) {
        uVar4 = 0x80000000;
        break;
      }
      uVar4 = ((int)(char)peVar6[-1] + uVar4 * 10) - 0x30;
      if (peVar6 == (error_handler *)end) goto LAB_0010da33;
      eVar2 = *peVar6;
      peVar6 = peVar6 + 1;
    } while ((byte)((char)eVar2 - 0x30U) < 10);
    peVar6 = peVar6 + -1;
    end = (char *)peVar6;
LAB_0010da33:
    if ((int)uVar4 < 0) {
      error_handler::on_error(peVar6,"number is too big");
    }
    ((handler->
     super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = uVar4;
  }
  else {
    if (iVar5 != 0x7b) {
      error_handler::on_error((error_handler *)begin,"missing precision specifier");
    }
    peVar6 = (error_handler *)(begin + 2);
    if (peVar6 != (error_handler *)end) {
      peVar6 = (error_handler *)
               parse_arg_id<char,fmt::v6::detail::precision_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&,char>>
                         ((char *)peVar6,end,
                          (precision_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
                           *)&stack0xffffffffffffffe8);
    }
    if ((peVar6 == (error_handler *)end) || (*peVar6 != (error_handler)0x7d)) {
      error_handler::on_error(peVar6,"invalid format string");
    }
    peVar6 = peVar6 + 1;
    end = (char *)peVar6;
  }
  tVar3 = (handler->checker_).arg_type_;
  if ((tVar3 < custom_type) && ((0x41feU >> (tVar3 & 0x1f) & 1) != 0)) {
    error_handler::on_error(peVar6,"precision not allowed for this argument type");
  }
  return (char *)(error_handler *)end;
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}